

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

int __thiscall mpt::layout::bind(layout *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  item_array<mpt::metatype> *a;
  convertable *this_00;
  bool bVar1;
  int iVar2;
  graph *this_01;
  char *id;
  undefined4 extraout_var;
  item<mpt::layout::graph> *piVar3;
  graph *from;
  object *from_00;
  undefined4 in_register_00000034;
  content<mpt::item<mpt::metatype>_> *pcVar4;
  content<mpt::item<mpt::metatype>_> *pcVar5;
  item_array<mpt::metatype> old;
  item_array<mpt::layout::graph> arr;
  
  a = &(this->super_item_group)._items;
  unique_array<mpt::item<mpt::metatype>_>::unique_array
            (&old.super_unique_array<mpt::item<mpt::metatype>_>,
             &a->super_unique_array<mpt::item<mpt::metatype>_>);
  if (CONCAT44(in_register_00000034,__fd) == 0) {
    arr.super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref =
         (unique_array<mpt::item<mpt::layout::graph>_>)&PTR_find_0014d4a8;
    iVar2 = item_group::bind(&this->super_item_group,(int)&arr,__addr,__len);
  }
  else {
    iVar2 = item_group::bind(&this->super_item_group,__fd,__addr,__len);
  }
  if (-1 < iVar2) {
    unique_array<mpt::item<mpt::layout::graph>_>::unique_array
              (&arr.super_unique_array<mpt::item<mpt::layout::graph>_>,-1);
    pcVar5 = (a->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
    pcVar4 = pcVar5 + 1;
    if (pcVar5 == (content<mpt::item<mpt::metatype>_> *)0x0) {
      pcVar5 = (content<mpt::item<mpt::metatype>_> *)0x0;
      pcVar4 = (content<mpt::item<mpt::metatype>_> *)0x0;
    }
    else {
      pcVar5 = (content<mpt::item<mpt::metatype>_> *)
               ((long)&(pcVar4->super_buffer)._vptr_buffer +
               ((pcVar5->super_buffer)._used & 0xffffffffffffffe0));
    }
    for (; pcVar4 != pcVar5; pcVar4 = pcVar4 + 1) {
      this_00 = (convertable *)(pcVar4->super_buffer)._vptr_buffer;
      if ((this_00 != (convertable *)0x0) &&
         (this_01 = convertable::operator_cast_to_graph_(this_00), this_01 != (graph *)0x0)) {
        id = identifier::name((identifier *)&(pcVar4->super_buffer)._content_traits);
        iVar2 = (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[2])
                          (this_01);
        if (CONCAT44(extraout_var,iVar2) == 0) {
          from = convertable::operator_cast_to_graph_(this_00);
          if ((from == (graph *)0x0) ||
             (from_00 = convertable::operator_cast_to_object_(this_00), from_00 == (object *)0x0)) {
            if (__addr != (sockaddr *)0x0) {
              if ((id == (char *)0x0) || (*id == '\0')) {
                logger::message((logger *)__addr,"mpt::layout::bind",4,"%s",
                                "unable to get graph information");
              }
              else {
                logger::message((logger *)__addr,"mpt::layout::bind",4,"%s: %s",
                                "unable to get graph information",id);
              }
            }
          }
          else {
            this_01 = (graph *)operator_new(0x68);
            graph::graph(this_01,from);
            bVar1 = object::set(&this_01->super_object,from_00,(logger *)__addr);
            if (bVar1) goto LAB_00139008;
            (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[1])
                      (this_01);
          }
        }
        else {
LAB_00139008:
          piVar3 = item_array<mpt::layout::graph>::append(&arr,this_01,id,-1);
          if (piVar3 == (item<mpt::layout::graph> *)0x0) {
            (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[1])
                      (this_01);
            iVar2 = 0;
            reference<mpt::content<mpt::item<mpt::metatype>_>_>::operator=
                      ((reference<mpt::content<mpt::item<mpt::metatype>_>_> *)a,
                       (reference<mpt::content<mpt::item<mpt::metatype>_>_> *)&old);
            goto LAB_0013911e;
          }
        }
      }
    }
    reference<mpt::content<mpt::item<mpt::layout::graph>_>_>::operator=
              ((reference<mpt::content<mpt::item<mpt::layout::graph>_>_> *)&this->_graphs,
               (reference<mpt::content<mpt::item<mpt::layout::graph>_>_> *)&arr);
    iVar2 = 1;
LAB_0013911e:
    reference<mpt::content<mpt::item<mpt::layout::graph>_>_>::~reference
              ((reference<mpt::content<mpt::item<mpt::layout::graph>_>_> *)&arr);
  }
  reference<mpt::content<mpt::item<mpt::metatype>_>_>::~reference
            ((reference<mpt::content<mpt::item<mpt::metatype>_>_> *)&old);
  return iVar2;
}

Assistant:

int layout::bind(const relation *rel, logger *out)
{
	item_array<metatype> old = _items;
	int ret = 0;
	
	if (!rel) {
		collection::relation me(*this);
		ret = item_group::bind(&me, out);
	} else {
		ret = item_group::bind(rel, out);
	}
	if (ret < 0) {
		return ret;
	}
	item_array<graph> arr;
	
	for (auto &it : _items) {
		metatype *mt;
		graph *g;
		if (!(mt = it.instance()) || !(g = *mt)) {
			continue;
		}
		const char *name = it.name();
		if (!g->addref()) {
			static const char _func[] = "mpt::layout::bind\0";
			::mpt::graph *d;
			object *o = 0;
			if (!(d = *mt) || !(o = *mt)) {
				const char *msg = MPT_tr("unable to get graph information");
				if (out) {
					if (!name || !*name) {
						out->message(_func, out->Warning, "%s", msg);
					} else {
						out->message(_func, out->Warning, "%s: %s", msg, name);
					}
				}
				continue;
			}
			g = new graph(d);
			
			if (o && !g->set(*o, out)) {
				g->unref();
				continue;
			}
		}
		if (!arr.append(g, name)) {
			g->unref();
			_items = old;
			return false;
		}
	}
	_graphs = arr;
	return true;
}